

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<3,_9,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  float local_a0;
  VecAccess<float,_4,_3> local_98;
  Matrix<float,_3,_3> local_7c;
  Vector<float,_3> local_58 [2];
  float local_40;
  undefined1 local_3c [4];
  Type_conflict in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[1] = (float)in1Type;
  in0.m_data.m_data[2].m_data[2] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    getInputValue<0,9>((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  if (in0.m_data.m_data[2].m_data[1] == 2.8026e-45) {
    local_a0 = getInputValue<2,1>(evalCtx,1);
  }
  else {
    local_a0 = getInputValue<0,1>(evalCtx,1);
  }
  local_40 = local_a0;
  tcu::operator/(&local_7c,(Matrix<float,_3,_3> *)local_3c,local_a0);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_58,&local_7c);
  tcu::Vector<float,_4>::xyz(&local_98,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_98,local_58);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_7c);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}